

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

char * checkInterfacePropertyCompatibility<char_const*>
                 (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,
                 CompatibleType t,char **param_6)

{
  cmGeneratorTarget *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__ptr;
  CompatibleType t_00;
  undefined8 uVar2;
  pointer pbVar3;
  int iVar4;
  cmValue cVar5;
  cmPropertyMap *pcVar6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar8;
  string *psVar9;
  size_t sVar10;
  char *pcVar11;
  ostream *poVar12;
  pointer ppcVar13;
  char *pcVar14;
  char *pcVar15;
  bool bVar16;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<bool,_const_char_*> pVar17;
  string reportEntry;
  string report;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  string interfaceProperty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a8;
  cmGeneratorTarget *local_2a0;
  string *local_298;
  undefined1 local_290 [36];
  CompatibleType local_26c;
  string local_268;
  _Base_ptr local_248;
  _Base_ptr local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  char *local_208;
  pointer local_200;
  undefined1 local_1f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  pointer local_1d8;
  undefined8 local_1d0;
  ios_base local_188 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_2a0 = tgt;
  local_26c = t;
  local_208 = defaultValue;
  cVar5 = cmGeneratorTarget::GetProperty(tgt,p);
  if (cVar5.Value == (string *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    pcVar11 = ((cVar5.Value)->_M_dataplus)._M_p;
  }
  pcVar6 = cmTarget::GetProperties(tgt->Target);
  cmPropertyMap::GetKeys_abi_cxx11_(&local_48,pcVar6);
  _Var7 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  pcVar1 = local_2a0;
  bVar16 = _Var7._M_current !=
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_248 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(local_2a0->LinkImplicitNullProperties)._M_t,p);
  local_238 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_240 = &(pcVar1->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_230 = _Var7._M_current;
  if (local_248 != local_240 &&
      _Var7._M_current !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x18d2,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = const char *]"
                 );
  }
  pvVar8 = cmGeneratorTarget::GetLinkImplementationClosure(local_2a0,config);
  if ((pvVar8->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar8->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    psVar9 = cmTarget::GetName_abi_cxx11_(local_2a0->Target);
    local_1f8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0xb;
    local_1f8._8_8_ = " * Target \"";
    local_1e8._M_allocated_capacity = 0;
    local_1d8 = (psVar9->_M_dataplus)._M_p;
    local_1e8._8_8_ = psVar9->_M_string_length;
    local_1d0 = 0;
    views._M_len = 2;
    views._M_array = (iterator)local_1f8;
    cmCatViews((string *)&local_228,views);
    if (local_230 != local_238) {
      std::__cxx11::string::append(local_228._M_local_buf);
      pcVar15 = "(unset)";
      if (pcVar11 != (char *)0x0) {
        pcVar15 = pcVar11;
      }
      local_1f8._0_8_ = &local_1e8;
      sVar10 = strlen(pcVar15);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,pcVar15,pcVar15 + sVar10);
      std::__cxx11::string::_M_append(local_228._M_local_buf,local_1f8._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._0_8_ != &local_1e8) {
        operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._M_allocated_capacity + 1));
      }
    }
    std::__cxx11::string::append(local_228._M_local_buf);
    std::operator+(&local_68,"INTERFACE_",p);
    local_2a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    iVar4 = std::__cxx11::string::compare((char *)p);
    if (iVar4 == 0) {
      local_290._0_8_ = local_2a0->LocalGenerator;
      std::
      make_unique<cmGeneratorExpressionInterpreter,cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*&>
                ((cmLocalGenerator **)local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
                 (cmGeneratorTarget **)config);
      uVar2 = local_1f8._0_8_;
      __ptr = local_2a8;
      local_2a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._0_8_;
      local_1f8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      if ((__ptr != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) &&
         (std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                    ((default_delete<cmGeneratorExpressionInterpreter> *)&local_2a8,
                     (cmGeneratorExpressionInterpreter *)__ptr),
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_1f8._0_8_ !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0)) {
        std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                  ((default_delete<cmGeneratorExpressionInterpreter> *)local_1f8,
                   (cmGeneratorExpressionInterpreter *)local_1f8._0_8_);
      }
    }
    ppcVar13 = (pvVar8->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_200 = (pvVar8->
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    pcVar15 = pcVar11;
    local_298 = p;
    if (ppcVar13 != local_200) {
      do {
        pcVar1 = *ppcVar13;
        pcVar6 = cmTarget::GetProperties(pcVar1->Target);
        cmPropertyMap::GetKeys_abi_cxx11_(&local_80,pcVar6);
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_80.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_80.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_68);
        pbVar3 = local_80.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pcVar11 = getTypedProperty<char_const*>
                            (pcVar1,&local_68,(cmGeneratorExpressionInterpreter *)local_2a8);
        local_290._0_8_ = local_290 + 0x10;
        local_290._8_8_ = 0;
        local_290[0x10] = '\0';
        if (_Var7._M_current == pbVar3) {
          pcVar14 = pcVar15;
          if (local_248 != local_240) {
            pcVar14 = "";
          }
          pcVar11 = pcVar15;
          if (local_230 == local_238) {
            pcVar11 = pcVar14;
          }
LAB_005a5198:
          iVar4 = 3;
        }
        else {
          std::__cxx11::string::append(local_290);
          t_00 = local_26c;
          psVar9 = cmTarget::GetName_abi_cxx11_(pcVar1->Target);
          std::__cxx11::string::_M_append(local_290,(ulong)(psVar9->_M_dataplus)._M_p);
          std::__cxx11::string::append(local_290);
          pcVar14 = pcVar11;
          if (pcVar11 == (char *)0x0) {
            pcVar14 = "(unset)";
          }
          local_1f8._0_8_ = &local_1e8;
          sVar10 = strlen(pcVar14);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1f8,pcVar14,pcVar14 + sVar10);
          std::__cxx11::string::_M_append(local_290,local_1f8._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._0_8_ != &local_1e8) {
            operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._M_allocated_capacity + 1));
          }
          std::__cxx11::string::append(local_290);
          if (local_230 == local_238) {
            if (local_248 == local_240) {
              if (bVar16) {
                pVar17 = consistentProperty<char_const*>(pcVar15,pcVar11,t_00);
                pcVar11 = pVar17.second;
                std::__cxx11::string::_M_append(local_228._M_local_buf,local_290._0_8_);
                compatibilityAgree_abi_cxx11_((string *)local_1f8,t_00,pcVar15 != pcVar11);
                std::__cxx11::string::_M_append(local_228._M_local_buf,local_1f8._0_8_);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._0_8_ != &local_1e8) {
                  operator_delete((void *)local_1f8._0_8_,
                                  (ulong)(local_1e8._M_allocated_capacity + 1));
                }
                bVar16 = true;
                if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1f8,"The INTERFACE_",0xe);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1f8,(local_298->_M_dataplus)._M_p,
                                       local_298->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12," property of \"",0xe);
                  psVar9 = cmTarget::GetName_abi_cxx11_(pcVar1->Target);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar12,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,"\" does\nnot agree with the value of ",0x23);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar12,(local_298->_M_dataplus)._M_p,
                                       local_298->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12," already determined\nfor \"",0x19);
                  psVar9 = cmTarget::GetName_abi_cxx11_(local_2a0->Target);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar12,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\".\n",3);
                  std::__cxx11::stringbuf::str();
                  cmSystemTools::Error(&local_268);
                  goto LAB_005a53f9;
                }
                goto LAB_005a515f;
              }
              local_1f8._0_8_ = &local_1e8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1f8,local_290._0_8_,
                         (pointer)(local_290._0_8_ + local_290._8_8_));
              std::__cxx11::string::append((char *)local_1f8);
              std::__cxx11::string::_M_append(local_228._M_local_buf,local_1f8._0_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._0_8_ != &local_1e8) {
                operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._M_allocated_capacity + 1)
                               );
              }
              iVar4 = 0;
              bVar16 = true;
            }
            else {
              pVar17 = consistentProperty<char_const*>("",pcVar11,t_00);
              std::__cxx11::string::_M_append(local_228._M_local_buf,local_290._0_8_);
              compatibilityAgree_abi_cxx11_((string *)local_1f8,t_00,pVar17.second != "");
              std::__cxx11::string::_M_append(local_228._M_local_buf,local_1f8._0_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._0_8_ != &local_1e8) {
                operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._M_allocated_capacity + 1)
                               );
              }
              pcVar11 = pVar17.second;
              if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
              goto LAB_005a5198;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Property ",9)
              ;
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1f8,(local_298->_M_dataplus)._M_p,
                                   local_298->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," on target \"",0xc);
              psVar9 = cmTarget::GetName_abi_cxx11_(local_2a0->Target);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,"\" is\nimplied to be ",0x13);
              pcVar11 = local_208;
              if (local_208 == (char *)0x0) {
                std::ios::clear((int)poVar12 + (int)poVar12->_vptr_basic_ostream[-3]);
              }
              else {
                sVar10 = strlen(local_208);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar11,sVar10);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,
                         " because it was used to determine the link libraries\nalready. The INTERFACE_"
                         ,0x4c);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(local_298->_M_dataplus)._M_p,local_298->_M_string_length
                                  );
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12," property on\ndependency \"",0x19);
              psVar9 = cmTarget::GetName_abi_cxx11_(pcVar1->Target);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,"\" is in conflict.\n",0x12);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(&local_268);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268._M_dataplus._M_p != &local_268.field_2) {
                operator_delete(local_268._M_dataplus._M_p,
                                local_268.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
              std::ios_base::~ios_base(local_188);
              iVar4 = 2;
              pcVar11 = "";
            }
          }
          else {
            pVar17 = consistentProperty<char_const*>(pcVar15,pcVar11,t_00);
            pcVar11 = pVar17.second;
            std::__cxx11::string::_M_append(local_228._M_local_buf,local_290._0_8_);
            compatibilityAgree_abi_cxx11_((string *)local_1f8,t_00,pcVar15 != pcVar11);
            std::__cxx11::string::_M_append(local_228._M_local_buf,local_1f8._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._0_8_ != &local_1e8) {
              operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._M_allocated_capacity + 1));
            }
            if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Property ",9)
              ;
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1f8,(local_298->_M_dataplus)._M_p,
                                   local_298->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," on target \"",0xc);
              psVar9 = cmTarget::GetName_abi_cxx11_(local_2a0->Target);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,"\" does\nnot match the INTERFACE_",0x1f);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(local_298->_M_dataplus)._M_p,local_298->_M_string_length
                                  );
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12," property requirement\nof dependency \"",0x25);
              psVar9 = cmTarget::GetName_abi_cxx11_(pcVar1->Target);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\".\n",3);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(&local_268);
LAB_005a53f9:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268._M_dataplus._M_p != &local_268.field_2) {
                operator_delete(local_268._M_dataplus._M_p,
                                local_268.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
              std::ios_base::~ios_base(local_188);
              iVar4 = 2;
              pcVar11 = pcVar15;
            }
            else {
LAB_005a515f:
              iVar4 = 3;
            }
          }
        }
        if ((cmLocalGenerator *)local_290._0_8_ != (cmLocalGenerator *)(local_290 + 0x10)) {
          operator_delete((void *)local_290._0_8_,CONCAT71(local_290._17_7_,local_290[0x10]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_80);
      } while (((iVar4 == 3) || (iVar4 == 0)) &&
              (ppcVar13 = ppcVar13 + 1, pcVar15 = pcVar11, ppcVar13 != local_200));
    }
    pcVar1 = local_2a0;
    pcVar15 = "(unset)";
    if (pcVar11 != (char *)0x0) {
      pcVar15 = pcVar11;
    }
    local_1f8._0_8_ = &local_1e8;
    sVar10 = strlen(pcVar15);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,pcVar15,pcVar15 + sVar10);
    compatibilityType_abi_cxx11_((string *)local_290,local_26c);
    cmGeneratorTarget::ReportPropertyOrigin
              (pcVar1,local_298,(string *)local_1f8,(string *)&local_228,(string *)local_290);
    if ((cmLocalGenerator *)local_290._0_8_ != (cmLocalGenerator *)(local_290 + 0x10)) {
      operator_delete((void *)local_290._0_8_,CONCAT71(local_290._17_7_,local_290[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._0_8_ != &local_1e8) {
      operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._M_allocated_capacity + 1));
    }
    if (local_2a8 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                ((default_delete<cmGeneratorExpressionInterpreter> *)&local_2a8,
                 (cmGeneratorExpressionInterpreter *)local_2a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_allocated_capacity != &local_218) {
      operator_delete((void *)local_228._M_allocated_capacity,local_218._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return pcVar11;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet = cm::contains(headPropKeys, p);

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = cmStrCat(" * Target \"", tgt->GetName());
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter;
  if (p == "POSITION_INDEPENDENT_CODE") {
    genexInterpreter = cm::make_unique<cmGeneratorExpressionInterpreter>(
      tgt->GetLocalGenerator(), config, tgt);
  }

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = cm::contains(propKeys, interfaceProperty);
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}